

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TokenBuffer.cpp
# Opt level: O1

void __thiscall TokenBuffer::fill(TokenBuffer *this,int amount)

{
  RefCount<Token> local_30;
  
  syncConsume(this);
  if ((ulong)((long)(this->queue).storage.
                    super__Vector_base<RefCount<Token>,_std::allocator<RefCount<Token>_>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)(this->queue).storage.
                    super__Vector_base<RefCount<Token>,_std::allocator<RefCount<Token>_>_>._M_impl.
                    super__Vector_impl_data._M_start >> 3) <
      (ulong)((long)this->markerOffset + (long)amount)) {
    do {
      (**this->input->_vptr_TokenStream)(&local_30);
      std::vector<RefCount<Token>,_std::allocator<RefCount<Token>_>_>::push_back
                (&(this->queue).storage,&local_30);
      RefCount<Token>::~RefCount(&local_30);
    } while ((ulong)((long)(this->queue).storage.
                           super__Vector_base<RefCount<Token>,_std::allocator<RefCount<Token>_>_>.
                           _M_impl.super__Vector_impl_data._M_finish -
                     (long)(this->queue).storage.
                           super__Vector_base<RefCount<Token>,_std::allocator<RefCount<Token>_>_>.
                           _M_impl.super__Vector_impl_data._M_start >> 3) <
             (ulong)((long)this->markerOffset + (long)amount));
  }
  return;
}

Assistant:

void TokenBuffer::fill(int amount)
{
	syncConsume();
	// Fill the buffer sufficiently to hold needed tokens
	while (queue.entries() < size_t(amount + markerOffset)) {
		// Append the next token
		queue.append(input.nextToken());
	}
}